

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Generators<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Catch::Generators::
makeGenerators<std::__cxx11::string,char_const(&)[6],char_const(&)[4],char_const(&)[6],char_const(&)[4]>
          (Generators<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Generators *this,char (*param_3) [4],char (*param_4) [6],
          char (*param_5) [4])

{
  size_t sVar1;
  pointer *__ptr;
  GeneratorWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  long lStack_38;
  
  local_50 = &local_40;
  sVar1 = strlen((char *)this);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,this,this + sVar1);
  local_58.m_generator._M_t.
  super___uniq_ptr_impl<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Head_base<0UL,_Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        )operator_new(0x28);
  *(undefined ***)
   local_58.m_generator._M_t.
   super___uniq_ptr_impl<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
   .
   super__Head_base<0UL,_Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
   ._M_head_impl = &PTR__SingleValueGenerator_001b2748;
  *(long **)((long)local_58.m_generator._M_t.
                   super___uniq_ptr_impl<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   .
                   super__Head_base<0UL,_Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
                   ._M_head_impl + 8) =
       (long *)((long)local_58.m_generator._M_t.
                      super___uniq_ptr_impl<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      .
                      super__Head_base<0UL,_Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
                      ._M_head_impl + 0x18);
  if (local_50 == &local_40) {
    *(long *)((long)local_58.m_generator._M_t.
                    super___uniq_ptr_impl<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    .
                    super__Head_base<0UL,_Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
                    ._M_head_impl + 0x18) = CONCAT71(uStack_3f,local_40);
    *(long *)((long)local_58.m_generator._M_t.
                    super___uniq_ptr_impl<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    .
                    super__Head_base<0UL,_Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
                    ._M_head_impl + 0x20) = lStack_38;
  }
  else {
    *(undefined1 **)
     ((long)local_58.m_generator._M_t.
            super___uniq_ptr_impl<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            .
            super__Head_base<0UL,_Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
            ._M_head_impl + 8) = local_50;
    *(long *)((long)local_58.m_generator._M_t.
                    super___uniq_ptr_impl<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    .
                    super__Head_base<0UL,_Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
                    ._M_head_impl + 0x18) = CONCAT71(uStack_3f,local_40);
  }
  *(long *)((long)local_58.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
                  ._M_head_impl + 0x10) = local_48;
  local_48 = 0;
  local_40 = 0;
  local_50 = &local_40;
  Generators<std::__cxx11::string>::
  Generators<Catch::Generators::GeneratorWrapper<std::__cxx11::string>,char_const(&)[4],char_const(&)[6],char_const(&)[4]>
            ((Generators<std::__cxx11::string> *)__return_storage_ptr__,&local_58,param_3,param_4,
             param_5);
  if (local_58.m_generator._M_t.
      super___uniq_ptr_impl<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .
      super__Head_base<0UL,_Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_58.m_generator._M_t.
                          super___uniq_ptr_impl<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          .
                          super__Head_base<0UL,_Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  local_58.m_generator._M_t.
  super___uniq_ptr_impl<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Head_base<0UL,_Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        )(__uniq_ptr_data<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<Catch::Generators::IGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_true>
          )0x0;
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

auto makeGenerators( as<T>, U&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( T( std::forward<U>( val ) ) ), std::forward<Gs>( moreGenerators )... );
    }